

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__write(uv_stream_t *stream)

{
  uint *puVar1;
  uint uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  long *plVar12;
  iovec *__iovec;
  msghdr msg;
  anon_union_64_2_d657c519 scratch;
  msghdr local_b0;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (-1 < (stream->io_watcher).fd) {
    do {
      puVar3 = (undefined1 *)stream->write_queue[0];
      if (stream->write_queue == (void **)puVar3) {
        return;
      }
      if (*(uv_stream_t **)(puVar3 + -8) != stream) {
        __assert_fail("req->handle == stream",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x2fb,"void uv__write(uv_stream_t *)");
      }
      iVar11 = *(int *)(puVar3 + 0x20) - *(uint *)(puVar3 + 0x10);
      __iovec = (iovec *)((ulong)*(uint *)(puVar3 + 0x10) * 0x10 + *(long *)(puVar3 + 0x18));
      iVar5 = uv__getiovmax();
      if (iVar5 <= iVar11) {
        iVar11 = iVar5;
      }
      if (*(long *)(puVar3 + -0x10) == 0) {
        do {
          iVar5 = (stream->io_watcher).fd;
          if (iVar11 == 1) {
            uVar8 = write(iVar5,__iovec->iov_base,__iovec->iov_len);
          }
          else {
            uVar8 = writev(iVar5,__iovec,iVar11);
          }
          if (uVar8 != 0xffffffffffffffff) goto LAB_005a5306;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        uVar8 = 0xffffffffffffffff;
      }
      else {
        iVar5 = *(int *)(*(long *)(puVar3 + -0x10) + 0x10);
        lVar7 = 0xb8;
        if ((iVar5 == 7) || (iVar5 == 0xc)) {
LAB_005a5231:
          uVar6 = *(uint *)(*(long *)(puVar3 + -0x10) + lVar7);
        }
        else {
          uVar6 = 0xffffffff;
          if (iVar5 == 0xf) {
            lVar7 = 0xb0;
            goto LAB_005a5231;
          }
        }
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        if ((int)uVar6 < 0) {
          __assert_fail("fd_to_send >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x31b,"void uv__write(uv_stream_t *)");
        }
        local_b0.msg_name = (void *)0x0;
        local_b0.msg_namelen = 0;
        local_b0.msg_iovlen = (size_t)iVar11;
        local_b0.msg_flags = 0;
        local_b0.msg_control = &local_78;
        local_b0.msg_controllen = 0x18;
        uStack_70 = 0x100000001;
        local_78 = 0x14;
        local_68 = (ulong)uVar6;
        local_b0.msg_iov = __iovec;
        do {
          uVar8 = sendmsg((stream->io_watcher).fd,&local_b0,0);
          if (uVar8 != 0xffffffffffffffff) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
      }
LAB_005a5306:
      if ((long)uVar8 < 0) {
        piVar9 = __errno_location();
        if (*piVar9 != 0xb) {
          *(int *)(puVar3 + 0x24) = -*piVar9;
          uv__write_req_finish((uv_write_t *)(puVar3 + -0x58));
          uv__io_stop(stream->loop,&stream->io_watcher,4);
          iVar11 = uv__io_active(&stream->io_watcher,1);
          if (iVar11 != 0) {
            return;
          }
          uVar6 = stream->flags;
          if ((uVar6 >> 0xe & 1) == 0) {
            return;
          }
          stream->flags = uVar6 & 0xffffbfff;
          if ((uVar6 >> 0xd & 1) == 0) {
            return;
          }
          puVar1 = &stream->loop->active_handles;
          *puVar1 = *puVar1 - 1;
          return;
        }
        if ((stream->flags & 0x80) == 0) goto LAB_005a53fa;
      }
      else {
        do {
          if ((long)uVar8 < 0) goto LAB_005a53fa;
          uVar6 = *(uint *)(puVar3 + 0x10);
          uVar2 = *(uint *)(puVar3 + 0x20);
          if (uVar2 <= uVar6) {
            __assert_fail("req->write_index < req->nbufs",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x36a,"void uv__write(uv_stream_t *)");
          }
          uVar4 = *(ulong *)(*(long *)(puVar3 + 0x18) + 8 + (ulong)uVar6 * 0x10);
          uVar10 = uVar8 - uVar4;
          if (uVar8 < uVar4) {
            plVar12 = (long *)(*(long *)(puVar3 + 0x18) + (ulong)uVar6 * 0x10);
            *plVar12 = *plVar12 + uVar8;
            plVar12[1] = uVar4 - uVar8;
            stream->write_queue_size = stream->write_queue_size - uVar8;
            iVar11 = 2;
            if ((stream->flags & 0x80) == 0) {
              iVar11 = 0xc;
            }
LAB_005a539c:
            uVar10 = 0;
          }
          else {
            *(uint *)(puVar3 + 0x10) = uVar6 + 1;
            if (stream->write_queue_size < uVar4) {
              __assert_fail("stream->write_queue_size >= len",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                            ,0x385,"void uv__write(uv_stream_t *)");
            }
            stream->write_queue_size = stream->write_queue_size - uVar4;
            iVar11 = 0;
            if (uVar6 + 1 == uVar2) {
              if (uVar10 != 0) {
                __assert_fail("n == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                              ,0x38a,"void uv__write(uv_stream_t *)");
              }
              uv__write_req_finish((uv_write_t *)(puVar3 + -0x58));
              iVar11 = 1;
              goto LAB_005a539c;
            }
          }
          uVar8 = uVar10;
        } while (iVar11 == 0);
        if (iVar11 != 2) {
          if (iVar11 != 0xc) {
            return;
          }
LAB_005a53fa:
          if (1 < uVar8 + 1) {
            __assert_fail("n == 0 || n == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x394,"void uv__write(uv_stream_t *)");
          }
          if ((stream->flags & 0x80) == 0) {
            uv__io_start(stream->loop,&stream->io_watcher,4);
            return;
          }
          __assert_fail("!(stream->flags & UV_STREAM_BLOCKING)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x397,"void uv__write(uv_stream_t *)");
        }
      }
    } while (-1 < (stream->io_watcher).fd);
  }
  __assert_fail("uv__stream_fd(stream) >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x2f4,"void uv__write(uv_stream_t *)");
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    struct msghdr msg;
    struct cmsghdr *cmsg;
    int fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do {
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  } else {
    do {
      if (iovcnt == 1) {
        n = write(uv__stream_fd(stream), iov[0].iov_base, iov[0].iov_len);
      } else {
        n = writev(uv__stream_fd(stream), iov, iovcnt);
      }
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  }

  if (n < 0) {
    if (errno != EAGAIN && errno != EWOULDBLOCK) {
      /* Error */
      req->error = -errno;
      uv__write_req_finish(req);
      uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
      if (!uv__io_active(&stream->io_watcher, POLLIN))
        uv__handle_stop(stream);
      uv__stream_osx_interrupt_select(stream);
      return;
    } else if (stream->flags & UV_STREAM_BLOCKING) {
      /* If this is a blocking stream, try again. */
      goto start;
    }
  } else {
    /* Successful write */

    while (n >= 0) {
      uv_buf_t* buf = &(req->bufs[req->write_index]);
      size_t len = buf->len;

      assert(req->write_index < req->nbufs);

      if ((size_t)n < len) {
        buf->base += n;
        buf->len -= n;
        stream->write_queue_size -= n;
        n = 0;

        /* There is more to write. */
        if (stream->flags & UV_STREAM_BLOCKING) {
          /*
           * If we're blocking then we should not be enabling the write
           * watcher - instead we need to try again.
           */
          goto start;
        } else {
          /* Break loop and ensure the watcher is pending. */
          break;
        }

      } else {
        /* Finished writing the buf at index req->write_index. */
        req->write_index++;

        assert((size_t)n >= len);
        n -= len;

        assert(stream->write_queue_size >= len);
        stream->write_queue_size -= len;

        if (req->write_index == req->nbufs) {
          /* Then we're done! */
          assert(n == 0);
          uv__write_req_finish(req);
          /* TODO: start trying to write the next request. */
          return;
        }
      }
    }
  }

  /* Either we've counted n down to zero or we've got EAGAIN. */
  assert(n == 0 || n == -1);

  /* Only non-blocking streams should use the write_watcher. */
  assert(!(stream->flags & UV_STREAM_BLOCKING));

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);
}